

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnGlobalImport(SharedValidator *this,Location *loc,Type type,bool mutable_)

{
  bool bVar1;
  GlobalType local_30;
  Enum local_28;
  byte local_21;
  Location *pLStack_20;
  bool mutable__local;
  Location *loc_local;
  SharedValidator *this_local;
  Type type_local;
  Result result;
  
  local_21 = mutable_;
  pLStack_20 = loc;
  loc_local = (Location *)this;
  this_local._0_4_ = type.enum_;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  if ((local_21 & 1) != 0) {
    bVar1 = Features::mutable_globals_enabled((Features *)this);
    if (!bVar1) {
      local_28 = (Enum)PrintError(this,pLStack_20,"mutable globals cannot be imported");
      Result::operator|=((Result *)((long)&this_local + 4),(Result)local_28);
    }
  }
  GlobalType::GlobalType(&local_30,this_local._0_4_,(bool)(local_21 & 1));
  std::vector<wabt::SharedValidator::GlobalType,_std::allocator<wabt::SharedValidator::GlobalType>_>
  ::push_back(&this->globals_,&local_30);
  this->num_imported_globals_ = this->num_imported_globals_ + 1;
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnGlobalImport(const Location& loc,
                                       Type type,
                                       bool mutable_) {
  Result result = Result::Ok;
  if (mutable_ && !options_.features.mutable_globals_enabled()) {
    result |= PrintError(loc, "mutable globals cannot be imported");
  }
  globals_.push_back(GlobalType{type, mutable_});
  ++num_imported_globals_;
  return result;
}